

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O1

istream * operator>>(istream *in,Company *company)

{
  int iVar1;
  long lVar2;
  
  std::istream::operator>>((istream *)in,&company->budget);
  operator>>(in,company->boss);
  iVar1 = Boss::getNumberOfEmployees(company->boss);
  if (0 < iVar1) {
    lVar2 = 0;
    do {
      operator>>(in,company->employees[lVar2]);
      lVar2 = lVar2 + 1;
      iVar1 = Boss::getNumberOfEmployees(company->boss);
    } while (lVar2 < iVar1);
  }
  return in;
}

Assistant:

istream &operator>>(istream &in, Company &company) {
    in >> company.budget;
    in >> (*company.boss);
    for (int i = 0; i < company.boss->getNumberOfEmployees(); ++i) {
        in >> (*company.employees[i]);
    }
    return in;
}